

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O2

int lupdate(lua_State *L)

{
  rwlock *lock;
  rwlock copy;
  int iVar1;
  size_t in_RAX;
  undefined8 *puVar2;
  void *__dest;
  size_t __n;
  char *__src;
  rwlock rVar3;
  size_t sz;
  
  sz = in_RAX;
  puVar2 = (undefined8 *)lua_touserdata(L,1);
  iVar1 = lua_isuserdata(L,2);
  if (iVar1 == 0) {
    __src = luaL_checklstring(L,2,&sz);
    __n = sz;
    __dest = malloc(sz);
    memcpy(__dest,__src,__n);
  }
  else {
    __dest = lua_touserdata(L,2);
    __n = luaL_checkinteger(L,3);
    sz = __n;
  }
  lock = (rwlock *)*puVar2;
  rVar3 = (rwlock)stm_newcopy(__dest,(int32_t)__n);
  rwlock_wlock(lock);
  copy = lock[2];
  lock[2] = rVar3;
  lock->write = 0;
  stm_releasecopy((stm_copy *)copy);
  return 0;
}

Assistant:

static int
lupdate(lua_State *L) {
	luaL_checktype(L, 1, LUA_TUSERDATA);
	luaL_checktype(L, 2, LUA_TLIGHTUSERDATA);
	luaL_checktype(L, 3, LUA_TTABLE);
	struct ctrl * c= lua_touserdata(L, 1);
	struct table *n = lua_touserdata(L, 2);
	if (c->root == n) {
		return luaL_error(L, "You should update a new object");
	}
	lua_settop(L, 3);
	lua_setuservalue(L, 1);
	c->update = n;

	return 0;
}